

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-multi-accept.c
# Opt level: O0

void cl_close_cb(uv_handle_t *handle)

{
  int iVar1;
  client_ctx *ctx;
  uv_handle_t *handle_local;
  
  iVar1 = *(int *)((long)&handle[2].u + 0x18) + -1;
  *(int *)((long)&handle[2].u + 0x18) = iVar1;
  if (iVar1 == 0) {
    uv_close((uv_handle_t *)&handle[3].next_closing,(uv_close_cb)0x0);
  }
  else {
    iVar1 = uv_tcp_init(handle->loop,(uv_tcp_t *)handle);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
              ,0x162,"0 == uv_tcp_init(handle->loop, (uv_tcp_t*) &ctx->client_handle)");
      abort();
    }
    iVar1 = uv_tcp_connect((uv_connect_t *)&handle[2].next_closing,(uv_tcp_t *)handle,
                           (sockaddr *)&listen_addr,cl_connect_cb);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
              ,0x166,
              "0 == uv_tcp_connect(&ctx->connect_req, (uv_tcp_t*) &ctx->client_handle, (const struct sockaddr*) &listen_addr, cl_connect_cb)"
             );
      abort();
    }
  }
  return;
}

Assistant:

static void cl_close_cb(uv_handle_t* handle) {
  struct client_ctx* ctx;

  ctx = container_of(handle, struct client_ctx, client_handle);

  if (--ctx->num_connects == 0) {
    uv_close((uv_handle_t*) &ctx->idle_handle, NULL);
    return;
  }

  ASSERT(0 == uv_tcp_init(handle->loop, (uv_tcp_t*) &ctx->client_handle));
  ASSERT(0 == uv_tcp_connect(&ctx->connect_req,
                             (uv_tcp_t*) &ctx->client_handle,
                             (const struct sockaddr*) &listen_addr,
                             cl_connect_cb));
}